

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

int floatx80_is_signaling_nan_mips(floatx80 a,float_status *status)

{
  flag fVar1;
  ulong uVar2;
  bool local_32;
  bool local_31;
  uint64_t aLow;
  float_status *status_local;
  floatx80 a_local;
  
  uVar2 = a.low;
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    local_32 = false;
    local_31 = local_32;
    if (((a.high & 0x7fff) == 0x7fff) &&
       (local_32 = false, local_31 = local_32,
       ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)) {
      local_31 = uVar2 == (uVar2 & 0xbfffffffffffffff);
    }
  }
  else {
    local_31 = (a.high & 0x7fff) == 0x7fff && 0x7fffffffffffffff < uVar2 << 1;
  }
  a_local._13_3_ = 0;
  a_local._12_1_ = local_31;
  return a_local._12_4_;
}

Assistant:

int floatx80_is_signaling_nan(floatx80 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    if (snan_bit_is_one(status)) {
        return ((a.high & 0x7FFF) == 0x7FFF)
            && ((a.low << 1) >= 0x8000000000000000ULL);
    } else {
        uint64_t aLow;

        aLow = a.low & ~UINT64_C(0x4000000000000000);
        return ((a.high & 0x7FFF) == 0x7FFF)
            && (uint64_t)(aLow << 1)
            && (a.low == aLow);
    }
#endif
}